

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

int __thiscall
lossless_neural_sound::expression_compiler::expression::
Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>::
structurally_compare_tree
          (Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *this,
          Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *rt)

{
  uint uVar1;
  Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
  *this_00;
  bool bVar2;
  Leaf_iterator right_iterator;
  Leaf_iterator left_iterator;
  Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *local_448;
  Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
  local_440;
  Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
  local_230;
  
  if (rt == (Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x3b9,
                  "int lossless_neural_sound::expression_compiler::expression::Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>::structurally_compare_tree(const Balanced_tree<Derived_class> *) const [Derived_class = lossless_neural_sound::expression_compiler::expression::Sum]"
                 );
  }
  this_00 = &local_230;
  memset(this_00,0,0x208);
  local_230.stack_top = 0x41;
  local_440.array[0] = &this->super_Expression_node;
  util::
  Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
  ::push(this_00,local_440.array);
  Leaf_iterator::find_leaf((Leaf_iterator *)this_00);
  memset(&local_440,0,0x208);
  local_440.stack_top = 0x41;
  local_448 = rt;
  util::
  Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
  ::push(&local_440,(Expression_node **)&local_448);
  Leaf_iterator::find_leaf((Leaf_iterator *)&local_440);
  bVar2 = true;
  if (local_230.stack_top != 0x41) {
    do {
      if (local_440.stack_top == 0x41) break;
      if ((0x40 < local_230.stack_top) || (0x40 < local_440.stack_top)) {
        __assert_fail("stack_top < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/util/array_stack.h"
                      ,0x33,
                      "const T &lossless_neural_sound::util::Array_stack<const lossless_neural_sound::expression_compiler::expression::Expression_node *, 65>::top() const [T = const lossless_neural_sound::expression_compiler::expression::Expression_node *, N = 65]"
                     );
      }
      uVar1 = Expression_node::structurally_compare
                        (local_230.array[local_230.stack_top],local_440.array[local_440.stack_top]);
      this_00 = (Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
                 *)((ulong)this_00 & 0xffffffff);
      if (uVar1 != 0) {
        this_00 = (Array_stack<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_65UL>
                   *)(ulong)uVar1;
      }
      if (uVar1 != 0) {
        return (int)this_00;
      }
      Leaf_iterator::operator++((Leaf_iterator *)&local_230);
      Leaf_iterator::operator++((Leaf_iterator *)&local_440);
    } while (local_230.stack_top != 0x41);
    bVar2 = local_230.stack_top == 0x41;
  }
  uVar1 = 0xffffffff;
  if ((bVar2 & local_440.stack_top != 0x41) == 0) {
    uVar1 = (uint)(byte)(~bVar2 & local_440.stack_top == 0x41);
  }
  return uVar1;
}

Assistant:

int structurally_compare_tree(const Balanced_tree *rt) const noexcept
    {
        assert(rt);
        auto left_iterator = Leaf_iterator(this);
        auto right_iterator = Leaf_iterator(rt);
        for(; left_iterator != Leaf_iterator() && right_iterator != Leaf_iterator();
            ++left_iterator, ++right_iterator)
        {
            int compare_result = (*left_iterator)->structurally_compare(*right_iterator);
            if(compare_result != 0)
                return compare_result;
        }
        bool left_at_end = left_iterator == Leaf_iterator();
        bool right_at_end = right_iterator == Leaf_iterator();
        if(left_at_end && !right_at_end)
            return -1;
        if(!left_at_end && right_at_end)
            return 1;
        return 0;
    }